

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uraid.c
# Opt level: O1

int device_after_raid(void)

{
  int iVar1;
  int iVar2;
  
  LispReadFds.__fds_bits[0xe] = 0;
  LispReadFds.__fds_bits[0xf] = 0;
  LispReadFds.__fds_bits[0xc] = 0;
  LispReadFds.__fds_bits[0xd] = 0;
  LispReadFds.__fds_bits[10] = 0;
  LispReadFds.__fds_bits[0xb] = 0;
  LispReadFds.__fds_bits[8] = 0;
  LispReadFds.__fds_bits[9] = 0;
  LispReadFds.__fds_bits[6] = 0;
  LispReadFds.__fds_bits[7] = 0;
  LispReadFds.__fds_bits[4] = 0;
  LispReadFds.__fds_bits[5] = 0;
  LispReadFds.__fds_bits[2] = 0;
  LispReadFds.__fds_bits[3] = 0;
  LispReadFds.__fds_bits[0] = 0;
  LispReadFds.__fds_bits[1] = 0;
  set_cursor();
  init_keyboard(1);
  int_init();
  (*(currentdsp->device).after_raid)(currentdsp);
  iVar1 = *(int *)(currentdsp->display_id + 0x10);
  iVar2 = iVar1 + 0x3f;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  LispReadFds.__fds_bits[iVar2 >> 6] =
       LispReadFds.__fds_bits[iVar2 >> 6] | 1L << ((byte)iVar1 & 0x3f);
  flush_display_buffer();
  int_unblock();
  *EmKbdAd568K = 0xffff;
  *EmKbdAd468K = 0xffff;
  *EmKbdAd368K = 0xffff;
  *EmKbdAd268K = 0xffff;
  *EmKbdAd168K = 0xffff;
  *EmRealUtilin68K = 0xffff;
  *EmKbdAd068K = 0xffff;
  return 0;
}

Assistant:

int device_after_raid(void) {
  extern DLword *EmMouseX68K, *EmMouseY68K, *EmKbdAd068K, *EmRealUtilin68K;
  extern DLword *EmKbdAd168K, *EmKbdAd268K, *EmKbdAd368K, *EmKbdAd468K, *EmKbdAd568K;
  FD_ZERO(&LispReadFds);
  if (re_init_display(DISPLAY_OFFSET, 65536 * 16 * 2) == -1) return (-1);
  set_cursor();
  init_keyboard(1);

#ifdef TRUECOLOR
  truecolor_after_raid();
#endif /* TRUECOLOR */

#ifdef MAIKO_ENABLE_ETHERNET
  init_ether();
#if defined(USE_DLPI)
  if (ether_fd > 0)
    if (ioctl(ether_fd, I_SETSIG, S_INPUT) != 0) {
      perror("after-uraid: I_SETSIG for ether failed:\n");
      close(ether_fd);
      ether_fd = -1;
      return (-1);
    }
#endif /* USE_DLPI */
#endif /* MAIKO_ENABLE_ETHERNET */

#ifdef XWINDOW
#ifdef I_SETSIG
  if (ioctl(ConnectionNumber(currentdsp->display_id), I_SETSIG, S_INPUT) < 0)
    perror("SETSIG on X fd failed");
#endif /* I_SETSIG */
#endif /* XWINDOW */

  int_init();


#ifdef MAIKO_ENABLE_ETHERNET
  if (ether_fd > 0) FD_SET(ether_fd, &LispReadFds);
#endif /* MAIKO_ENABLE_ETHERNET */

#ifdef XWINDOW
  (currentdsp->device.after_raid)(currentdsp);
  FD_SET(ConnectionNumber(currentdsp->display_id), &LispReadFds);
  flush_display_buffer();
#elif DOS
  (currentdsp->device.after_raid)(currentdsp);
  (currentmouse->device.after_raid)(currentmouse, currentdsp);
  (currentkbd->device.after_raid)(currentkbd);
  flush_display_buffer();
#endif /* XWINDOW | DOS */

  int_unblock();
  *EmKbdAd068K = *EmRealUtilin68K = *EmKbdAd168K = *EmKbdAd268K = *EmKbdAd368K = *EmKbdAd468K =
      *EmKbdAd568K = KB_ALLUP;
  return (0);
}